

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

LongLong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryUsed(SystemInformationImplementation *this)

{
  int iVar1;
  LongLong LVar2;
  LongLong values2 [2];
  LongLong values4 [4];
  longlong local_38;
  long lStack_30;
  longlong local_28;
  long lStack_20;
  long local_18;
  long lStack_10;
  
  local_38 = 0;
  lStack_30 = 0;
  iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                    ("/proc/meminfo",&PTR_anon_var_dwarf_123afce_006831a0,&local_38);
  if (iVar1 == 0) {
    LVar2 = local_38 - lStack_30;
  }
  else {
    local_18 = 0;
    lStack_10 = 0;
    local_28 = 0;
    lStack_20 = 0;
    iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                      ("/proc/meminfo",&PTR_anon_var_dwarf_123afce_006831c0,&local_28);
    if (iVar1 == 0) {
      LVar2 = local_28 - (lStack_20 + local_18 + lStack_10);
    }
    else {
      LVar2 = (LongLong)iVar1;
    }
  }
  return LVar2;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetHostMemoryUsed()
{
#if defined(_WIN32)
#if defined(_MSC_VER) && _MSC_VER < 1300
  MEMORYSTATUS stat;
  stat.dwLength = sizeof(stat);
  GlobalMemoryStatus(&stat);
  return (stat.dwTotalPhys - stat.dwAvailPhys) / 1024;
#else
  MEMORYSTATUSEX statex;
  statex.dwLength = sizeof(statex);
  GlobalMemoryStatusEx(&statex);
  return (statex.ullTotalPhys - statex.ullAvailPhys) / 1024;
#endif
#elif defined(__linux)
  // First try to use MemAvailable, but it only works on newer kernels
  const char* names2[3] = { "MemTotal:", "MemAvailable:", NULL };
  SystemInformation::LongLong values2[2] = { SystemInformation::LongLong(0) };
  int ierr = GetFieldsFromFile("/proc/meminfo", names2, values2);
  if (ierr) {
    const char* names4[5] = { "MemTotal:", "MemFree:", "Buffers:", "Cached:",
                              NULL };
    SystemInformation::LongLong values4[4] = { SystemInformation::LongLong(
      0) };
    ierr = GetFieldsFromFile("/proc/meminfo", names4, values4);
    if (ierr) {
      return ierr;
    }
    SystemInformation::LongLong& memTotal = values4[0];
    SystemInformation::LongLong& memFree = values4[1];
    SystemInformation::LongLong& memBuffers = values4[2];
    SystemInformation::LongLong& memCached = values4[3];
    return memTotal - memFree - memBuffers - memCached;
  }
  SystemInformation::LongLong& memTotal = values2[0];
  SystemInformation::LongLong& memAvail = values2[1];
  return memTotal - memAvail;
#elif defined(__APPLE__)
  SystemInformation::LongLong psz = getpagesize();
  if (psz < 1) {
    return -1;
  }
  const char* names[3] = { "Pages wired down:", "Pages active:", NULL };
  SystemInformation::LongLong values[2] = { SystemInformation::LongLong(0) };
  int ierr = GetFieldsFromCommand("vm_stat", names, values);
  if (ierr) {
    return -1;
  }
  SystemInformation::LongLong& vmWired = values[0];
  SystemInformation::LongLong& vmActive = values[1];
  return ((vmActive + vmWired) * psz) / 1024;
#else
  return 0;
#endif
}